

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  int iVar1;
  int in_ESI;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_gej pj;
  secp256k1_ge p;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_scalar *in_stack_00000588;
  secp256k1_scalar *in_stack_00000590;
  secp256k1_gej *in_stack_00000598;
  secp256k1_gej *in_stack_000005a0;
  secp256k1_scalar *in_stack_000009b0;
  secp256k1_ge *in_stack_000009b8;
  secp256k1_gej *in_stack_000009c0;
  secp256k1_ge *in_stack_fffffffffffffd58;
  secp256k1_gej *in_stack_fffffffffffffd60;
  secp256k1_scalar *in_stack_fffffffffffffd68;
  secp256k1_scalar *in_stack_fffffffffffffd70;
  secp256k1_ge *in_stack_fffffffffffffd80;
  secp256k1_scalar *in_stack_fffffffffffffd88;
  secp256k1_scalar *in_stack_fffffffffffffd90;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffe98;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffea0;
  secp256k1_fe *in_stack_ffffffffffffff08;
  secp256k1_gej *in_stack_ffffffffffffff10;
  secp256k1_gej *in_stack_ffffffffffffff18;
  secp256k1_gej *in_stack_ffffffffffffff20;
  
  testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffd80);
  secp256k1_scalar_add
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (secp256k1_scalar *)in_stack_fffffffffffffd80);
  secp256k1_scalar_negate(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  if (in_ESI == 0) {
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  else {
    testutil_random_ge_test(in_stack_fffffffffffffd80);
    secp256k1_gej_set_ge(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    if (in_ESI == 1) {
      secp256k1_ecmult(in_stack_000005a0,in_stack_00000598,in_stack_00000590,in_stack_00000588);
      secp256k1_ecmult(in_stack_000005a0,in_stack_00000598,in_stack_00000590,in_stack_00000588);
      secp256k1_ecmult(in_stack_000005a0,in_stack_00000598,in_stack_00000590,in_stack_00000588);
    }
    else {
      secp256k1_ecmult_const(in_stack_000009c0,in_stack_000009b8,in_stack_000009b0);
      secp256k1_ecmult_const(in_stack_000009c0,in_stack_000009b8,in_stack_000009b0);
      secp256k1_ecmult_const(in_stack_000009c0,in_stack_000009b8,in_stack_000009b0);
    }
  }
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x139417);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1116,"test condition failed: secp256k1_gej_is_infinity(&ptj)");
    abort();
  }
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}